

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiStreamParser.cpp
# Opt level: O1

Bit32u __thiscall
MT32Emu::MidiStreamParserImpl::parseSysex(MidiStreamParserImpl *this,Bit8u *stream,Bit32u length)

{
  byte bVar1;
  uint uVar2;
  bool bVar3;
  Bit32u BVar4;
  ulong in_RAX;
  int iVar5;
  uint uVar6;
  
  BVar4 = 1;
  do {
    if (length <= BVar4) goto LAB_00111b4c;
    uVar6 = BVar4 + 1;
    bVar1 = stream[BVar4];
    iVar5 = 0;
    uVar2 = uVar6;
    if ((char)bVar1 < '\0') {
      if (bVar1 == 0xf7) {
        (*this->midiReceiver->_vptr_MidiReceiver[1])(this->midiReceiver,stream,(ulong)uVar6);
        iVar5 = 1;
        in_RAX = (ulong)uVar6;
      }
      else {
        iVar5 = 3;
        uVar2 = BVar4;
        if (bVar1 < 0xf8) {
          (**this->midiReporter->_vptr_MidiReporter)();
          iVar5 = 1;
          in_RAX = (ulong)BVar4;
          uVar2 = uVar6;
        }
      }
    }
    BVar4 = uVar2;
  } while (iVar5 == 0);
  if (iVar5 == 3) {
LAB_00111b4c:
    this->streamBufferSize = BVar4;
    bVar3 = checkStreamBufferCapacity(this,false);
    if (bVar3) {
      memcpy(this->streamBuffer,stream,(ulong)BVar4);
    }
    else {
      *this->streamBuffer = *stream;
      this->streamBufferSize = this->streamBufferCapacity;
    }
  }
  else {
    BVar4 = (Bit32u)in_RAX;
  }
  return BVar4;
}

Assistant:

Bit32u MidiStreamParserImpl::parseSysex(const Bit8u stream[], const Bit32u length) {
	// Find SysEx length
	Bit32u sysexLength = 1;
	while (sysexLength < length) {
		Bit8u nextByte = stream[sysexLength++];
		if (0x80 <= nextByte) {
			if (nextByte == 0xF7) {
				// End of SysEx
				midiReceiver.handleSysex(stream, sysexLength);
				return sysexLength;
			}
			if (0xF8 <= nextByte) {
				// The System Realtime message must be processed right after return
				// but the SysEx is actually fragmented and to be reconstructed in streamBuffer
				--sysexLength;
				break;
			}
			// Illegal status byte in SysEx message, aborting
			midiReporter.printDebug("parseSysex: SysEx message lacks end-of-sysex (0xf7), ignored");
			// Continue parsing from that point
			return sysexLength - 1;
		}
	}

	// Store incomplete SysEx message for further processing
	streamBufferSize = sysexLength;
	if (checkStreamBufferCapacity(false)) {
		memcpy(streamBuffer, stream, sysexLength);
	} else {
		// Not enough buffer capacity, don't care about the real buffer content, just mark the first byte
		*streamBuffer = *stream;
		streamBufferSize = streamBufferCapacity;
	}
	return sysexLength;
}